

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_default<void(AbstractModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::def_helper<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
          (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,char *name,undefined8 param_3,undefined8 param_4,long *param_5)

{
  undefined1 local_22;
  undefined1 local_21;
  object_base local_20;
  
  detail::
  make_function_dispatch<void(PythonModuleClient::*)(std::__cxx11::string,unsigned_int),boost::python::default_call_policies,boost::python::detail::keywords<0ul>>
            (&local_20,*(undefined8 *)*param_5,((undefined8 *)*param_5)[1],&local_21,&local_22);
  objects::add_to_namespace((object *)this,name,(object *)&local_20);
  api::object_base::~object_base(&local_20);
  return;
}

Assistant:

inline void def_default(
        char const* name
        , Fn
        , Helper const& helper
        , mpl::bool_<true>)
    {
        detail::error::virtual_function_default<W,Fn>::must_be_derived_class_member(
            helper.default_implementation());
            
        objects::add_to_namespace(
            *this, name,
            make_function(
                helper.default_implementation(), helper.policies(), helper.keywords())
            );
    }